

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O1

void __thiscall OpenMD::RhoR::process(RhoR *this)

{
  long *plVar1;
  int *piVar2;
  pointer __s;
  pointer pdVar3;
  pointer __s_00;
  pointer piVar4;
  double dVar5;
  uint i_1;
  int iVar6;
  StuntDouble *pSVar7;
  int whichFrame;
  long lVar8;
  double tmp;
  Thermo thermo;
  int i;
  Vector3d CenterOfMass;
  DumpReader reader;
  SelectionSet local_1308;
  SelectionEvaluator *local_12f0;
  Thermo local_12e8;
  int local_12dc;
  double local_12d8 [4];
  double local_12b8 [3];
  Vector3d local_12a0;
  DumpReader local_1288;
  
  local_12e8.info_ = (this->super_StaticAnalyser).info_;
  DumpReader::DumpReader(&local_1288,local_12e8.info_,&(this->super_StaticAnalyser).dumpFilename_);
  iVar6 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar6 / (this->super_StaticAnalyser).step_;
  __s = (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar3 = (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar3) {
    memset(__s,0,((long)pdVar3 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  __s_00 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s_00 != piVar4) {
    memset(__s_00,0,((long)piVar4 + (-4 - (long)__s_00) & 0xfffffffffffffffcU) + 4);
  }
  if (0 < iVar6) {
    local_12f0 = &this->evaluator_;
    whichFrame = 0;
    do {
      DumpReader::readFrame(&local_1288,whichFrame);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      Thermo::getCom(&local_12a0,&local_12e8);
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1308,local_12f0);
        lVar8 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar8),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1308.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8
                     ));
          lVar8 = lVar8 + 0x28;
        } while (lVar8 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1308.bitsets_);
      }
      pSVar7 = SelectionManager::beginSelected(&this->seleMan_,&local_12dc);
      while (pSVar7 != (StuntDouble *)0x0) {
        lVar8 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar8 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
        plVar1 = (long *)(lVar8 + (long)pSVar7->localIndex_ * 0x18);
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar1;
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar1[1];
        local_12d8[0] = 0.0;
        local_12d8[1] = 0.0;
        local_12d8[2] = 0.0;
        lVar8 = 0;
        do {
          local_12d8[lVar8] =
               local_12a0.super_Vector<double,_3U>.data_[lVar8] -
               (double)(&local_1308.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_12b8[2] = local_12d8[2];
        local_12b8[0] = local_12d8[0];
        local_12b8[1] = local_12d8[1];
        dVar5 = 0.0;
        lVar8 = 0;
        do {
          dVar5 = dVar5 + local_12b8[lVar8] * local_12b8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        if (dVar5 < this->len_) {
          piVar2 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)(dVar5 / this->deltaR_);
          *piVar2 = *piVar2 + 1;
        }
        pSVar7 = SelectionManager::nextSelected(&this->seleMan_,&local_12dc);
      }
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_;
    } while (whichFrame < iVar6);
  }
  processHistogram(this);
  writeRhoR(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RhoR::process() {
    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    std::fill(avgRhoR_.begin(), avgRhoR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      int i;
      StuntDouble* sd;
      reader.readFrame(istep);
      currentSnapshot_      = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        Vector3d pos = sd->getPos();
        Vector3d r12 = CenterOfMass - pos;

        RealType distance = r12.length();

        if (distance < len_) {
          int whichBin = int(distance / deltaR_);
          histogram_[whichBin] += 1;
        }
      }
    }

    processHistogram();
    writeRhoR();
  }